

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O0

float __thiscall
basisu::palette_index_reorderer::pick_side
          (palette_index_reorderer *this,uint32_t num_syms,uint32_t entry_to_move,
          pEntry_dist_func pDist_func,void *pCtx,float dist_func_weight)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  uint *puVar4;
  vector<unsigned_int> *in_RCX;
  undefined4 in_EDX;
  long in_RDI;
  undefined8 in_R8;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  float c;
  float w_right;
  float w_left;
  int r;
  int count;
  uint32_t j;
  int r_count;
  int l_count;
  float which_side;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 uVar7;
  vector<unsigned_int> *in_stack_ffffffffffffff80;
  vector<unsigned_int> *this_00;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  
  local_28 = 0.0;
  local_2c = 0;
  local_30 = 0;
  local_34 = 0;
  while( true ) {
    uVar1 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x20));
    if (uVar1 <= local_34) break;
    vector<unsigned_int>::operator[]
              (in_stack_ffffffffffffff80,
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    uVar1 = get_hist((palette_index_reorderer *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                     (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x20));
    iVar3 = uVar2 + 1 + (local_34 + 1) * -2;
    local_28 = (float)(int)(iVar3 * uVar1) + local_28;
    if (iVar3 < 0) {
      local_30 = -iVar3 * uVar1 + local_30;
    }
    else {
      local_2c = iVar3 * uVar1 + local_2c;
    }
    local_34 = local_34 + 1;
  }
  if (in_RCX != (vector<unsigned_int> *)0x0) {
    fVar5 = 1.0 - in_XMM0_Da;
    fVar6 = in_XMM0_Da + 1.0;
    uVar7 = in_EDX;
    this_00 = in_RCX;
    puVar4 = vector<unsigned_int>::front(in_RCX);
    c = (float)(*(code *)this_00)(uVar7,*puVar4,in_R8);
    fVar5 = lerp<float,float>(fVar5,fVar6,c);
    puVar4 = vector<unsigned_int>::back(this_00);
    fVar6 = (float)(*(code *)in_RCX)(in_EDX,*puVar4,in_R8);
    fVar6 = lerp<float,float>(1.0 - in_XMM0_Da,in_XMM0_Da + 1.0,fVar6);
    local_28 = fVar5 * (float)local_2c - fVar6 * (float)local_30;
  }
  return local_28;
}

Assistant:

float palette_index_reorderer::pick_side(uint32_t num_syms, uint32_t entry_to_move, pEntry_dist_func pDist_func, void *pCtx, float dist_func_weight)
	{
		float which_side = 0;

		int l_count = 0, r_count = 0;
		for (uint32_t j = 0; j < m_entries_picked.size(); j++)
		{
			const int count = get_hist(entry_to_move, m_entries_picked[j], num_syms), r = ((int)m_entries_picked.size() + 1 - 2 * (j + 1));
			which_side += static_cast<float>(r * count);
			if (r >= 0)
				l_count += r * count;
			else
				r_count += -r * count;
		}

		if (pDist_func)
		{
			float w_left = lerp(1.0f - dist_func_weight, 1.0f + dist_func_weight, (*pDist_func)(entry_to_move, m_entries_picked.front(), pCtx));
			float w_right = lerp(1.0f - dist_func_weight, 1.0f + dist_func_weight, (*pDist_func)(entry_to_move, m_entries_picked.back(), pCtx));
			which_side = w_left * l_count - w_right * r_count;
		}
		return which_side;
	}